

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
vkt::tessellation::generateReferenceQuadTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,SpacingMode spacingMode,int inner0,int inner1,int outer0,
          int outer1,int outer2,int outer3)

{
  uint inner1_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  Vector<float,_3> local_68;
  int local_5c;
  _Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_58;
  float local_40;
  float local_3c;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = inner1;
  if (inner1 == 1 || inner0 == 1) {
    if ((((inner0 != 1) || (inner1 != 1)) || (outer0 != 1)) ||
       (((outer1 != 1 || (outer2 != 1)) || (outer3 != 1)))) {
      inner1_00 = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
      if (inner0 < 2) {
        inner0 = inner1_00;
      }
      if (1 < inner1) {
        inner1_00 = inner1;
      }
      generateReferenceQuadTessCoords
                (__return_storage_ptr__,spacingMode,inner0,inner1_00,outer0,outer1,outer2,outer3);
      goto LAB_0072076b;
    }
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
               &local_68);
    local_68.m_data[0] = 1.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
               &local_68);
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 1.0;
    local_68.m_data[2] = 0.0;
    local_38 = __return_storage_ptr__;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
               &local_68);
    local_68.m_data[0] = 1.0;
    local_68.m_data[1] = 1.0;
    local_68.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
               &local_68);
  }
  else {
    fVar5 = (float)outer0;
    iVar2 = 0;
    if (outer0 < 1) {
      outer0 = 0;
    }
    local_38 = __return_storage_ptr__;
    for (; outer0 != iVar2; iVar2 = iVar2 + 1) {
      local_68.m_data[1] = (float)iVar2 / fVar5;
      local_68.m_data[0] = 0.0;
      local_68.m_data[2] = 0.0;
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
                 &local_68);
    }
    fVar5 = (float)outer1;
    iVar2 = 0;
    if (outer1 < 1) {
      outer1 = 0;
    }
    for (; outer1 != iVar2; iVar2 = iVar2 + 1) {
      local_68.m_data[0] = 1.0 - (float)iVar2 / fVar5;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
                 &local_68);
    }
    iVar1 = 0;
    iVar2 = outer2;
    if (outer2 < 1) {
      iVar2 = iVar1;
    }
    for (; iVar2 != iVar1; iVar1 = iVar1 + 1) {
      local_68.m_data[1] = 1.0 - (float)iVar1 / (float)outer2;
      local_68.m_data[0] = 1.0;
      local_68.m_data[2] = 0.0;
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
                 &local_68);
    }
    iVar1 = 0;
    iVar2 = outer3;
    if (outer3 < 1) {
      iVar2 = iVar1;
    }
    for (; iVar2 != iVar1; iVar1 = iVar1 + 1) {
      local_68.m_data[0] = (float)iVar1 / (float)outer3;
      local_68.m_data[1] = 1.0;
      local_68.m_data[2] = 0.0;
      std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
      emplace_back<tcu::Vector<float,3>>
                ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
                 &local_68);
    }
    local_3c = (float)inner0;
    iVar4 = inner0 + -1;
    local_40 = (float)local_5c;
    iVar1 = local_5c + -1;
    iVar2 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    while (iVar2 != iVar1) {
      iVar2 = iVar2 + 1;
      fVar5 = (float)iVar2 / local_40;
      for (iVar3 = 1; iVar3 - iVar4 != 1; iVar3 = iVar3 + 1) {
        local_68.m_data[0] = (float)iVar3 / local_3c;
        local_68.m_data[2] = 0.0;
        local_68.m_data[1] = fVar5;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_58,
                   &local_68);
      }
    }
  }
  (local_38->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_start = local_58._M_impl.super__Vector_impl_data._M_start;
  (local_38->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = local_58._M_impl.super__Vector_impl_data._M_finish;
  (local_38->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__ = local_38;
LAB_0072076b:
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec3> generateReferenceQuadTessCoords (const SpacingMode	spacingMode,
														const int			inner0,
														const int			inner1,
														const int			outer0,
														const int			outer1,
														const int			outer2,
														const int			outer3)
{
	std::vector<tcu::Vec3> tessCoords;

	if (inner0 == 1 || inner1 == 1)
	{
		if (inner0 == 1 && inner1 == 1 && outer0 == 1 && outer1 == 1 && outer2 == 1 && outer3 == 1)
		{
			tessCoords.push_back(tcu::Vec3(0.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(1.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 1.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(1.0f, 1.0f, 0.0f));
			return tessCoords;
		}
		else
			return generateReferenceQuadTessCoords(spacingMode, inner0 > 1 ? inner0 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																inner1 > 1 ? inner1 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																outer0, outer1, outer2, outer3);
	}
	else
	{
		for (int i = 0; i < outer0; i++) { const float v = (float)i / (float)outer0; tessCoords.push_back(tcu::Vec3(    0.0f,        v, 0.0f)); }
		for (int i = 0; i < outer1; i++) { const float v = (float)i / (float)outer1; tessCoords.push_back(tcu::Vec3(1.0f - v,     0.0f, 0.0f)); }
		for (int i = 0; i < outer2; i++) { const float v = (float)i / (float)outer2; tessCoords.push_back(tcu::Vec3(    1.0f, 1.0f - v, 0.0f)); }
		for (int i = 0; i < outer3; i++) { const float v = (float)i / (float)outer3; tessCoords.push_back(tcu::Vec3(       v,     1.0f, 0.0f)); }

		for (int innerVtxY = 0; innerVtxY < inner1-1; innerVtxY++)
		for (int innerVtxX = 0; innerVtxX < inner0-1; innerVtxX++)
			tessCoords.push_back(tcu::Vec3((float)(innerVtxX + 1) / (float)inner0,
										   (float)(innerVtxY + 1) / (float)inner1,
										   0.0f));

		return tessCoords;
	}
}